

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGStructurizer::query_reachability_split_loop_header
          (CFGStructurizer *this,CFGNode *from,CFGNode *to,CFGNode *end_node)

{
  bool bVar1;
  bool bVar2;
  bool to_reaches_header;
  bool from_reaches_header;
  CFGNode *end_node_local;
  CFGNode *to_local;
  CFGNode *from_local;
  CFGStructurizer *this_local;
  
  if (end_node->pred_back_edge == (CFGNode *)0x0) {
    this_local._7_1_ = query_reachability(this,from,to);
  }
  else {
    bVar1 = query_reachability(this,from,end_node);
    bVar2 = query_reachability(this,to,end_node);
    if (bVar1 == bVar2) {
      this_local._7_1_ = query_reachability(this,from,to);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CFGStructurizer::query_reachability_split_loop_header(const CFGNode &from, const CFGNode &to, const CFGNode &end_node) const
{
	// A special query where from and to must lie on the same side of a loop header to be considered reachable.
	if (!end_node.pred_back_edge)
		return query_reachability(from, to);

	bool from_reaches_header = query_reachability(from, end_node);
	bool to_reaches_header = query_reachability(to, end_node);
	if (from_reaches_header != to_reaches_header)
		return false;

	return query_reachability(from, to);
}